

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

Matrix<float> __thiscall Matrix<float>::operator+(Matrix<float> *this,Matrix<float> *M1)

{
  int *in_RDX;
  float **extraout_RDX;
  float **extraout_RDX_00;
  float **ppfVar1;
  Matrix<float> MVar2;
  int local_2c;
  int local_28;
  int j;
  int i;
  Matrix<float> *M1_local;
  Matrix<float> *this_local;
  Matrix<float> *add;
  
  if ((M1->n == *in_RDX) && (M1->m == in_RDX[1])) {
    Matrix(this,M1->n,M1->m);
    ppfVar1 = extraout_RDX_00;
    for (local_28 = 0; local_28 < M1->n; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < M1->m; local_2c = local_2c + 1) {
        ppfVar1 = (float **)(long)local_2c;
        this->M[local_28][local_2c] =
             M1->M[local_28][local_2c] +
             *(float *)(*(long *)(*(long *)(in_RDX + 2) + (long)local_28 * 8) + (long)ppfVar1 * 4);
      }
    }
  }
  else {
    Matrix(this);
    ppfVar1 = extraout_RDX;
  }
  MVar2.M = ppfVar1;
  MVar2._0_8_ = this;
  return MVar2;
}

Assistant:

Matrix operator+(const Matrix& M1) const {
    if (n != M1.n || m != M1.m) {
      Matrix<T> Zero;
      return Zero;
    }
    Matrix<T> add(n, m);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        add.M[i][j] = M[i][j] + M1.M[i][j];
      }
    }
    return add;
  }